

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O1

void __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>::
KeyValueShrinkableStorage
          (KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
           *this,string *notSortedStorageFilename,string *sortedStorageFilename,
          shared_ptr<supermap::io::FileManager> *fileManager,
          InnerRegisterSupplier *innerRegisterSupplier)

{
  undefined8 uVar1;
  shared_ptr<supermap::io::FileManager> local_d0;
  shared_ptr<supermap::io::FileManager> local_c0;
  path local_b0;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:59:60)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:59:60)>
             ::_M_manager;
  OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ::OrderedStorage((OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
                    *)this,(InnerRegisterSupplier *)&local_48);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00202cb0;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00202ba8;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_b0,sortedStorageFilename,auto_format);
  local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:62:24)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:62:24)>
             ::_M_manager;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ::SingleFileIndexedStorage
            (&(this->sortedStorage_).
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
             ,&local_b0,&local_c0,(InnerRegisterSupplier *)&local_68);
  (this->sortedStorage_).
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00202da8;
  (this->sortedStorage_).
  super_Findable<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_supermap::Key<1UL>_>
  ._vptr_Findable = (_func_int **)&DAT_00202df0;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_b0,notSortedStorageFilename,auto_format);
  local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:65:27)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:65:27)>
             ::_M_manager;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  ::SingleFileIndexedStorage
            (&this->notSortedStorage_,&local_b0,&local_d0,(InnerRegisterSupplier *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_b0);
  *(undefined8 *)&(this->innerRegisterSupplier_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->innerRegisterSupplier_).super__Function_base._M_functor + 8) = 0;
  (this->innerRegisterSupplier_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->innerRegisterSupplier_)._M_invoker = innerRegisterSupplier->_M_invoker;
  if ((innerRegisterSupplier->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(innerRegisterSupplier->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->innerRegisterSupplier_).super__Function_base._M_functor =
         *(undefined8 *)&(innerRegisterSupplier->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->innerRegisterSupplier_).super__Function_base._M_functor + 8) =
         uVar1;
    (this->innerRegisterSupplier_).super__Function_base._M_manager =
         (innerRegisterSupplier->super__Function_base)._M_manager;
    (innerRegisterSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    innerRegisterSupplier->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

explicit KeyValueShrinkableStorage(
        const std::string &notSortedStorageFilename,
        const std::string &sortedStorageFilename,
        std::shared_ptr<io::FileManager> fileManager,
        InnerRegisterSupplier innerRegisterSupplier
    ) : IndexedStorage<KeyValue<Key, Value>, IndexT, void>([]() { return std::make_unique<VoidRegister<KV>>(); }),
        sortedStorage_(sortedStorageFilename,
                       fileManager,
                       []() { return std::make_unique<VoidRegister<KV>>(); }),
        notSortedStorage_(notSortedStorageFilename,
                          fileManager,
                          []() { return std::make_unique<VoidRegister<KV>>(); }),
        innerRegisterSupplier_(std::move(innerRegisterSupplier)) {
    }